

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PatternVarSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PatternVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Type *args_2)

{
  string_view name;
  PatternVarSymbol *this_00;
  
  this_00 = (PatternVarSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PatternVarSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (PatternVarSymbol *)allocateSlow(this,0x160,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::PatternVarSymbol::PatternVarSymbol(this_00,name,*args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }